

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CampaignReader.cpp
# Opt level: O1

void __thiscall adios2::core::engine::CampaignReader::InitTransports(CampaignReader *this)

{
  pointer *pppIVar1;
  pointer *pppEVar2;
  Mode mode;
  pointer pcVar3;
  size_type sVar4;
  unsigned_long uVar5;
  pointer pbVar6;
  _Base_ptr p_Var7;
  ADIOS *this_00;
  pointer pCVar8;
  size_t __n;
  _Alloc_hider _Var9;
  CampaignBPFile *pCVar10;
  sqlite3 *db;
  iterator __position;
  iterator __position_00;
  uint uVar11;
  bool bVar12;
  char cVar13;
  int iVar14;
  uint uVar15;
  DataType DVar16;
  long *plVar17;
  char *pcVar18;
  undefined8 *puVar19;
  ostream *poVar20;
  _Rb_tree_node_base *p_Var21;
  IO *this_01;
  const_iterator cVar22;
  Remote *this_02;
  HostOptions *hostOptions;
  Engine *pEVar23;
  Variable<signed_char> *variable;
  Variable<char> *variable_00;
  Variable<std::complex<float>_> *variable_01;
  Variable<unsigned_char> *variable_02;
  Variable<std::complex<double>_> *variable_03;
  Variable<double> *variable_04;
  Variable<int> *variable_05;
  Variable<long> *variable_06;
  Variable<unsigned_long> *variable_07;
  Variable<short> *variable_08;
  Variable<unsigned_short> *variable_09;
  Variable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *variable_10;
  Variable<unsigned_int> *variable_11;
  Variable<long_double> *variable_12;
  Variable<float> *variable_13;
  Attribute<signed_char> *attribute;
  Attribute<char> *attribute_00;
  Attribute<std::complex<float>_> *attribute_01;
  Attribute<unsigned_char> *attribute_02;
  Attribute<std::complex<double>_> *attribute_03;
  Attribute<double> *attribute_04;
  Attribute<int> *attribute_05;
  Attribute<long> *attribute_06;
  Attribute<unsigned_long> *attribute_07;
  Attribute<short> *attribute_08;
  Attribute<unsigned_short> *attribute_09;
  Attribute<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *attribute_10;
  Attribute<unsigned_int> *attribute_11;
  Attribute<long_double> *attribute_12;
  Attribute<float> *attribute_13;
  _Rb_tree_node_base *p_Var24;
  _Base_ptr p_Var25;
  ulong *puVar26;
  size_type *psVar27;
  long *plVar28;
  uint uVar29;
  uint uVar30;
  uint __uval;
  uint uVar31;
  pointer pCVar32;
  CampaignBPFile *bpfile;
  undefined8 uVar33;
  ulong uVar34;
  pointer pCVar35;
  CampaignBPFile *bpf;
  ulong uVar36;
  long lVar37;
  __string_type __str_4;
  string __str_3;
  string fname;
  __string_type __str;
  VarInternalInfo internalInfo;
  string localPath;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>_>
  amap;
  string path;
  string path2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_7e0;
  string local_7c0;
  Remote *local_7a0;
  long *local_798;
  ulong local_790;
  long local_788;
  long lStack_780;
  undefined1 local_778 [48];
  VarInternalInfo local_748;
  string local_728;
  undefined1 local_708 [48];
  long local_6d8;
  sqlite3 **local_6d0;
  Comm local_6c8;
  uint local_6bc;
  string local_6b8;
  string local_698;
  undefined1 local_678 [8];
  _Alloc_hider _Stack_670;
  undefined1 local_668 [24];
  undefined8 uStack_650;
  ios_base local_580 [480];
  vector<adios2::core::Engine*,std::allocator<adios2::core::Engine*>> *local_3a0;
  vector<adios2::core::IO*,std::allocator<adios2::core::IO*>> *local_398;
  undefined8 local_390;
  ulong *local_388;
  string *local_380;
  _Rb_tree_node_base *local_378;
  string local_370;
  string local_350;
  string local_330;
  string local_310;
  string local_2f0;
  string local_2d0;
  string local_2b0;
  string local_290;
  string local_270;
  string local_250;
  string local_230;
  string local_210;
  string local_1f0;
  string local_1d0;
  string local_1b0;
  string local_190;
  string local_170;
  string local_150;
  string local_130;
  string local_110;
  string local_f0;
  string local_d0;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  local_698._M_dataplus._M_p = (pointer)&local_698.field_2;
  pcVar3 = (this->super_Engine).m_Name._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_698,pcVar3,pcVar3 + (this->super_Engine).m_Name._M_string_length);
  bVar12 = adios2sys::SystemTools::FileExists(&local_698);
  if ((((!bVar12) && (*local_698._M_dataplus._M_p != '/')) && (*local_698._M_dataplus._M_p != '\\'))
     && (sVar4 = (this->m_Options).campaignstorepath._M_string_length, sVar4 != 0)) {
    pcVar3 = (this->m_Options).campaignstorepath._M_dataplus._M_p;
    local_778._0_8_ = local_778 + 0x10;
    std::__cxx11::string::_M_construct<char*>((string *)local_778,pcVar3,pcVar3 + sVar4);
    std::__cxx11::string::_M_replace_aux((ulong)local_778,local_778._8_8_,0,'\x01');
    plVar17 = (long *)std::__cxx11::string::_M_append
                                (local_778,(ulong)(this->super_Engine).m_Name._M_dataplus._M_p);
    puVar26 = (ulong *)(plVar17 + 2);
    if ((ulong *)*plVar17 == puVar26) {
      local_668._0_8_ = *puVar26;
      local_668._8_8_ = plVar17[3];
      local_678 = (undefined1  [8])local_668;
    }
    else {
      local_668._0_8_ = *puVar26;
      local_678 = (undefined1  [8])*plVar17;
    }
    _Stack_670._M_p = (pointer)plVar17[1];
    *plVar17 = (long)puVar26;
    plVar17[1] = 0;
    *(undefined1 *)(plVar17 + 2) = 0;
    if ((undefined1 *)local_778._0_8_ != local_778 + 0x10) {
      operator_delete((void *)local_778._0_8_);
    }
    bVar12 = adios2sys::SystemTools::FileExists((string *)local_678);
    if (bVar12) {
      std::__cxx11::string::_M_assign((string *)&local_698);
    }
    if (local_678 != (undefined1  [8])local_668) {
      operator_delete((void *)local_678);
    }
  }
  local_6d0 = &this->m_DB;
  iVar14 = sqlite3_open(local_698._M_dataplus._M_p);
  if (iVar14 != 0) {
    pcVar18 = (char *)sqlite3_errmsg(*local_6d0);
    std::__cxx11::string::string((string *)local_678,pcVar18,(allocator *)local_778);
    sqlite3_close(*local_6d0);
    local_778._0_8_ = local_778 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_778,"Engine","");
    local_708._0_8_ = local_708 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_708,"CampaignReader","");
    local_728._M_dataplus._M_p = (pointer)&local_728.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_728,"Open","");
    std::operator+(&local_7e0,"Cannot open database",&local_698);
    puVar19 = (undefined8 *)std::__cxx11::string::append((char *)&local_7e0);
    plVar17 = puVar19 + 2;
    if ((long *)*puVar19 == plVar17) {
      local_788 = *plVar17;
      lStack_780 = puVar19[3];
      local_798 = &local_788;
    }
    else {
      local_788 = *plVar17;
      local_798 = (long *)*puVar19;
    }
    local_790 = puVar19[1];
    *puVar19 = plVar17;
    puVar19[1] = 0;
    *(undefined1 *)(puVar19 + 2) = 0;
    plVar17 = (long *)std::__cxx11::string::_M_append((char *)&local_798,(ulong)local_678);
    puVar26 = (ulong *)(plVar17 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar17 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)puVar26) {
      local_7c0.field_2._M_allocated_capacity = *puVar26;
      local_7c0.field_2._8_8_ = plVar17[3];
      local_7c0._M_dataplus._M_p = (pointer)&local_7c0.field_2;
    }
    else {
      local_7c0.field_2._M_allocated_capacity = *puVar26;
      local_7c0._M_dataplus._M_p = (pointer)*plVar17;
    }
    local_7c0._M_string_length = plVar17[1];
    *plVar17 = (long)puVar26;
    plVar17[1] = 0;
    *(undefined1 *)(plVar17 + 2) = 0;
    helper::Throw<std::invalid_argument>
              ((string *)local_778,(string *)local_708,&local_728,&local_7c0,-1);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_7c0._M_dataplus._M_p != &local_7c0.field_2) {
      operator_delete(local_7c0._M_dataplus._M_p);
    }
    if (local_798 != &local_788) {
      operator_delete(local_798);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_7e0._M_dataplus._M_p != &local_7e0.field_2) {
      operator_delete(local_7e0._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_728._M_dataplus._M_p != &local_728.field_2) {
      operator_delete(local_728._M_dataplus._M_p);
    }
    if ((undefined1 *)local_708._0_8_ != local_708 + 0x10) {
      operator_delete((void *)local_708._0_8_);
    }
    if ((undefined1 *)local_778._0_8_ != local_778 + 0x10) {
      operator_delete((void *)local_778._0_8_);
    }
    if (local_678 != (undefined1  [8])local_668) {
      operator_delete((void *)local_678);
    }
  }
  ReadCampaignData(this->m_DB,&this->m_CampaignData);
  if (0 < (this->m_Options).verbose) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Local hostname = ",0x11);
    poVar20 = std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cout,(this->m_Options).hostname._M_dataplus._M_p,
                         (this->m_Options).hostname._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar20,"\n",1);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Database result:\n  version = ",0x1d);
    poVar20 = std::ostream::_M_insert<double>((this->m_CampaignData).version.version);
    std::__ostream_insert<char,std::char_traits<char>>(poVar20,"\n  hosts:\n",10);
    pCVar35 = (this->m_CampaignData).hosts.
              super__Vector_base<adios2::core::engine::CampaignHost,_std::allocator<adios2::core::engine::CampaignHost>_>
              ._M_impl.super__Vector_impl_data._M_start;
    if ((this->m_CampaignData).hosts.
        super__Vector_base<adios2::core::engine::CampaignHost,_std::allocator<adios2::core::engine::CampaignHost>_>
        ._M_impl.super__Vector_impl_data._M_finish != pCVar35) {
      uVar36 = 0;
      do {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"    host = ",0xb);
        pCVar35 = pCVar35 + uVar36;
        poVar20 = std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)&std::cout,(pCVar35->hostname)._M_dataplus._M_p,
                             (pCVar35->hostname)._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar20,"  long name = ",0xe);
        poVar20 = std::__ostream_insert<char,std::char_traits<char>>
                            (poVar20,(pCVar35->longhostname)._M_dataplus._M_p,
                             (pCVar35->longhostname)._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar20,"  directories: \n",0x10);
        if ((pCVar35->dirIdx).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
            _M_impl.super__Vector_impl_data._M_finish !=
            (pCVar35->dirIdx).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
            _M_impl.super__Vector_impl_data._M_start) {
          uVar34 = 0;
          do {
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cout,"      dir = ",0xc);
            uVar5 = (pCVar35->dirIdx).
                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                    super__Vector_impl_data._M_start[uVar34];
            pbVar6 = (this->m_CampaignData).directory.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            poVar20 = std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)&std::cout,pbVar6[uVar5]._M_dataplus._M_p,
                                 pbVar6[uVar5]._M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>(poVar20,"\n",1);
            uVar34 = uVar34 + 1;
          } while (uVar34 < (ulong)((long)(pCVar35->dirIdx).
                                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                          ._M_impl.super__Vector_impl_data._M_finish -
                                    (long)(pCVar35->dirIdx).
                                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                          ._M_impl.super__Vector_impl_data._M_start >> 3));
        }
        uVar36 = uVar36 + 1;
        pCVar35 = (this->m_CampaignData).hosts.
                  super__Vector_base<adios2::core::engine::CampaignHost,_std::allocator<adios2::core::engine::CampaignHost>_>
                  ._M_impl.super__Vector_impl_data._M_start;
      } while (uVar36 < (ulong)(((long)(this->m_CampaignData).hosts.
                                       super__Vector_base<adios2::core::engine::CampaignHost,_std::allocator<adios2::core::engine::CampaignHost>_>
                                       ._M_impl.super__Vector_impl_data._M_finish - (long)pCVar35 >>
                                3) * 0x2e8ba2e8ba2e8ba3));
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"  keys:\n",8);
    pCVar32 = (this->m_CampaignData).keys.
              super__Vector_base<adios2::core::engine::CampaignKey,_std::allocator<adios2::core::engine::CampaignKey>_>
              ._M_impl.super__Vector_impl_data._M_start;
    if ((this->m_CampaignData).keys.
        super__Vector_base<adios2::core::engine::CampaignKey,_std::allocator<adios2::core::engine::CampaignKey>_>
        ._M_impl.super__Vector_impl_data._M_finish != pCVar32) {
      lVar37 = 8;
      uVar36 = 0;
      do {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"    key = ",10);
        poVar20 = std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)&std::cout,*(char **)((long)pCVar32 + lVar37 + -8),
                             *(long *)((long)&(pCVar32->id)._M_dataplus._M_p + lVar37));
        std::__ostream_insert<char,std::char_traits<char>>(poVar20,"\n",1);
        uVar36 = uVar36 + 1;
        pCVar32 = (this->m_CampaignData).keys.
                  super__Vector_base<adios2::core::engine::CampaignKey,_std::allocator<adios2::core::engine::CampaignKey>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        lVar37 = lVar37 + 0x40;
      } while (uVar36 < (ulong)((long)(this->m_CampaignData).keys.
                                      super__Vector_base<adios2::core::engine::CampaignKey,_std::allocator<adios2::core::engine::CampaignKey>_>
                                      ._M_impl.super__Vector_impl_data._M_finish - (long)pCVar32 >>
                               6));
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"  datasets:\n",0xc);
    for (p_Var21 = (this->m_CampaignData).bpdatasets._M_t._M_impl.super__Rb_tree_header._M_header.
                   _M_left;
        (_Rb_tree_header *)p_Var21 !=
        &(this->m_CampaignData).bpdatasets._M_t._M_impl.super__Rb_tree_header;
        p_Var21 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var21)) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"    ",4);
      pCVar35 = (this->m_CampaignData).hosts.
                super__Vector_base<adios2::core::engine::CampaignHost,_std::allocator<adios2::core::engine::CampaignHost>_>
                ._M_impl.super__Vector_impl_data._M_start;
      poVar20 = std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cout,
                           pCVar35[(long)p_Var21[3]._M_parent].hostname._M_dataplus._M_p,
                           pCVar35[(long)p_Var21[3]._M_parent].hostname._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar20,":",1);
      pbVar6 = (this->m_CampaignData).directory.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      poVar20 = std::__ostream_insert<char,std::char_traits<char>>
                          (poVar20,pbVar6[(long)p_Var21[3]._M_left]._M_dataplus._M_p,
                           pbVar6[(long)p_Var21[3]._M_left]._M_string_length);
      local_678[0] = 0x2f;
      poVar20 = std::__ostream_insert<char,std::char_traits<char>>(poVar20,local_678,1);
      poVar20 = std::__ostream_insert<char,std::char_traits<char>>
                          (poVar20,(char *)p_Var21[2]._M_parent,(long)p_Var21[2]._M_left);
      std::__ostream_insert<char,std::char_traits<char>>(poVar20,"\n",1);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"      uuid: ",0xc);
      poVar20 = std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cout,(char *)p_Var21[1]._M_parent,
                           (long)p_Var21[1]._M_left);
      std::__ostream_insert<char,std::char_traits<char>>(poVar20,"\n",1);
      p_Var7 = p_Var21[4]._M_left;
      for (p_Var25 = p_Var21[4]._M_parent; p_Var25 != p_Var7;
          p_Var25 = (_Base_ptr)&p_Var25[2]._M_parent) {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"      file: ",0xc)
        ;
        poVar20 = std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)&std::cout,*(char **)p_Var25,(long)p_Var25->_M_parent);
        std::__ostream_insert<char,std::char_traits<char>>(poVar20,"\n",1);
      }
    }
  }
  p_Var25 = (this->m_CampaignData).bpdatasets._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  local_378 = &(this->m_CampaignData).bpdatasets._M_t._M_impl.super__Rb_tree_header._M_header;
  if (p_Var25 == local_378) {
    this_02 = (Remote *)0x0;
  }
  else {
    local_388 = _VTT;
    local_390 = _pthread_rwlock_init;
    local_380 = (string *)&(this->super_Engine).m_Comm;
    local_398 = (vector<adios2::core::IO*,std::allocator<adios2::core::IO*>> *)&this->m_IOs;
    local_3a0 = (vector<adios2::core::Engine*,std::allocator<adios2::core::Engine*>> *)
                &this->m_Engines;
    this_02 = (Remote *)0x0;
    uVar31 = 0xffffffff;
    do {
      uVar31 = uVar31 + 1;
      uVar29 = 1;
      if (9 < uVar31) {
        uVar30 = uVar31;
        uVar11 = 4;
        do {
          uVar29 = uVar11;
          if (uVar30 < 100) {
            uVar29 = uVar29 - 2;
            goto LAB_0065fa2b;
          }
          if (uVar30 < 1000) {
            uVar29 = uVar29 - 1;
            goto LAB_0065fa2b;
          }
          if (uVar30 < 10000) goto LAB_0065fa2b;
          bVar12 = 99999 < uVar30;
          uVar30 = uVar30 / 10000;
          uVar11 = uVar29 + 4;
        } while (bVar12);
        uVar29 = uVar29 + 1;
      }
LAB_0065fa2b:
      this_00 = ((this->super_Engine).m_IO)->m_ADIOS;
      local_678 = (undefined1  [8])local_668;
      local_7a0 = this_02;
      std::__cxx11::string::_M_construct
                ((ulong)local_678,(char)uVar29 - (char)((int)uVar31 >> 0x1f));
      local_6bc = uVar31;
      std::__detail::__to_chars_10_impl<unsigned_int>
                ((char *)((long)local_678 + (ulong)(uVar31 >> 0x1f)),uVar29,uVar31);
      plVar17 = (long *)std::__cxx11::string::replace((ulong)local_678,0,(char *)0x0,0x76093e);
      this_02 = local_7a0;
      local_6b8._M_dataplus._M_p = (pointer)&local_6b8.field_2;
      psVar27 = (size_type *)(plVar17 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar17 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar27) {
        local_6b8.field_2._M_allocated_capacity = *psVar27;
        local_6b8.field_2._8_8_ = plVar17[3];
      }
      else {
        local_6b8.field_2._M_allocated_capacity = *psVar27;
        local_6b8._M_dataplus._M_p = (pointer)*plVar17;
      }
      local_6b8._M_string_length = plVar17[1];
      *plVar17 = (long)psVar27;
      plVar17[1] = 0;
      *(undefined1 *)(plVar17 + 2) = 0;
      this_01 = ADIOS::DeclareIO(this_00,&local_6b8,Auto);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_6b8._M_dataplus._M_p != &local_6b8.field_2) {
        operator_delete(local_6b8._M_dataplus._M_p);
      }
      if (local_678 != (undefined1  [8])local_668) {
        operator_delete((void *)local_678);
      }
      local_728._M_dataplus._M_p = (pointer)&local_728.field_2;
      local_728._M_string_length = 0;
      local_728.field_2._M_local_buf[0] = '\0';
      pCVar8 = (this->m_CampaignData).hosts.
               super__Vector_base<adios2::core::engine::CampaignHost,_std::allocator<adios2::core::engine::CampaignHost>_>
               ._M_impl.super__Vector_impl_data._M_start;
      pCVar35 = pCVar8 + (long)p_Var25[3]._M_parent;
      __n = pCVar8[(long)p_Var25[3]._M_parent].hostname._M_string_length;
      if ((__n == (this->m_Options).hostname._M_string_length) &&
         ((__n == 0 ||
          (iVar14 = bcmp((pCVar35->hostname)._M_dataplus._M_p,
                         (this->m_Options).hostname._M_dataplus._M_p,__n), iVar14 == 0)))) {
        pbVar6 = (this->m_CampaignData).directory.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        local_778._0_8_ = local_778 + 0x10;
        pcVar3 = pbVar6[(long)p_Var25[3]._M_left]._M_dataplus._M_p;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_778,pcVar3,
                   pcVar3 + pbVar6[(long)p_Var25[3]._M_left]._M_string_length);
        std::__cxx11::string::_M_replace_aux((ulong)local_778,local_778._8_8_,0,'\x01');
        plVar17 = (long *)std::__cxx11::string::_M_append
                                    ((char *)local_778,(ulong)p_Var25[2]._M_parent);
        puVar26 = (ulong *)(plVar17 + 2);
        if ((ulong *)*plVar17 == puVar26) {
          local_668._0_8_ = *puVar26;
          local_668._8_8_ = plVar17[3];
          local_678 = (undefined1  [8])local_668;
        }
        else {
          local_668._0_8_ = *puVar26;
          local_678 = (undefined1  [8])*plVar17;
        }
        _Stack_670._M_p = (pointer)plVar17[1];
        *plVar17 = (long)puVar26;
        plVar17[1] = 0;
        *(undefined1 *)(plVar17 + 2) = 0;
        std::__cxx11::string::operator=((string *)&local_728,(string *)local_678);
        if (local_678 != (undefined1  [8])local_668) {
          operator_delete((void *)local_678);
        }
        if ((undefined1 *)local_778._0_8_ != local_778 + 0x10) {
          operator_delete((void *)local_778._0_8_);
        }
        if (0 < (this->m_Options).verbose) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,"Open local file ",0x10);
          poVar20 = std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)&std::cout,local_728._M_dataplus._M_p,
                               local_728._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>(poVar20,"\n",1);
        }
LAB_00661177:
        mode = (this->super_Engine).m_OpenMode;
        local_678 = (undefined1  [8])local_668;
        _Stack_670._M_p = (pointer)0x0;
        local_668._0_8_ = local_668._0_8_ & 0xffffffffffffff00;
        helper::Comm::Duplicate(&local_6c8,local_380);
        pEVar23 = IO::Open(this_01,&local_728,mode,&local_6c8,(char *)0x0,0);
        helper::Comm::~Comm(&local_6c8);
        if (local_678 != (undefined1  [8])local_668) {
          operator_delete((void *)local_678);
        }
        __position._M_current =
             (this->m_IOs).
             super__Vector_base<adios2::core::IO_*,_std::allocator<adios2::core::IO_*>_>._M_impl.
             super__Vector_impl_data._M_finish;
        if (__position._M_current ==
            (this->m_IOs).
            super__Vector_base<adios2::core::IO_*,_std::allocator<adios2::core::IO_*>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          local_678 = (undefined1  [8])this_01;
          std::vector<adios2::core::IO*,std::allocator<adios2::core::IO*>>::
          _M_realloc_insert<adios2::core::IO*>(local_398,__position,(IO **)local_678);
        }
        else {
          *__position._M_current = this_01;
          pppIVar1 = &(this->m_IOs).
                      super__Vector_base<adios2::core::IO_*,_std::allocator<adios2::core::IO_*>_>.
                      _M_impl.super__Vector_impl_data._M_finish;
          *pppIVar1 = *pppIVar1 + 1;
        }
        __position_00._M_current =
             (this->m_Engines).
             super__Vector_base<adios2::core::Engine_*,_std::allocator<adios2::core::Engine_*>_>.
             _M_impl.super__Vector_impl_data._M_finish;
        if (__position_00._M_current ==
            (this->m_Engines).
            super__Vector_base<adios2::core::Engine_*,_std::allocator<adios2::core::Engine_*>_>.
            _M_impl.super__Vector_impl_data._M_end_of_storage) {
          local_678 = (undefined1  [8])pEVar23;
          std::vector<adios2::core::Engine*,std::allocator<adios2::core::Engine*>>::
          _M_realloc_insert<adios2::core::Engine*>(local_3a0,__position_00,(Engine **)local_678);
        }
        else {
          *__position_00._M_current = pEVar23;
          pppEVar2 = &(this->m_Engines).
                      super__Vector_base<adios2::core::Engine_*,_std::allocator<adios2::core::Engine_*>_>
                      ._M_impl.super__Vector_impl_data._M_finish;
          *pppEVar2 = *pppEVar2 + 1;
        }
        local_668._0_8_ = 0;
        local_678 = (undefined1  [8])0x0;
        _Stack_670._M_p = (pointer)0x0;
        local_668._8_8_ = &_Stack_670;
        uStack_650._0_4_ = None;
        uStack_650._4_4_ = 0;
        local_668._16_8_ = local_668._8_8_;
        IO::GetAvailableVariables
                  ((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>_>
                    *)local_778,this_01,
                   (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)local_678);
        std::
        _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)local_678);
        local_678 = (undefined1  [8])local_668;
        _Stack_670._M_p = (pointer)0x0;
        local_668._0_8_ = local_668._0_8_ & 0xffffffffffffff00;
        local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_d0,"/","");
        IO::GetAvailableAttributes
                  ((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>_>
                    *)local_708,this_01,(string *)local_678,&local_d0,false);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
          operator_delete(local_d0._M_dataplus._M_p);
        }
        if (local_678 != (undefined1  [8])local_668) {
          operator_delete((void *)local_678);
        }
        local_748.ioIdx =
             ((long)(this->m_IOs).
                    super__Vector_base<adios2::core::IO_*,_std::allocator<adios2::core::IO_*>_>.
                    _M_impl.super__Vector_impl_data._M_finish -
              (long)(this->m_IOs).
                    super__Vector_base<adios2::core::IO_*,_std::allocator<adios2::core::IO_*>_>.
                    _M_impl.super__Vector_impl_data._M_start >> 3) - 1;
        local_748.engineIdx =
             ((long)(this->m_Engines).
                    super__Vector_base<adios2::core::Engine_*,_std::allocator<adios2::core::Engine_*>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)(this->m_Engines).
                    super__Vector_base<adios2::core::Engine_*,_std::allocator<adios2::core::Engine_*>_>
                    ._M_impl.super__Vector_impl_data._M_start >> 3) - 1;
        local_748.originalVar = (size_t *)0x0;
        for (p_Var21 = (_Rb_tree_node_base *)local_778._24_8_;
            p_Var24 = (_Rb_tree_node_base *)local_708._24_8_,
            p_Var21 != (_Rb_tree_node_base *)(local_778 + 8);
            p_Var21 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var21)) {
          local_7c0._M_dataplus._M_p = (pointer)&local_7c0.field_2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_7c0,*(long *)(p_Var21 + 1),
                     (long)&(p_Var21[1]._M_parent)->_M_color + *(long *)(p_Var21 + 1));
          local_798 = &local_788;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_798,p_Var25[2]._M_parent,
                     (long)&(p_Var25[2]._M_left)->_M_color + (long)p_Var25[2]._M_parent);
          local_678 = (undefined1  [8])local_668;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)local_678,local_798,(undefined1 *)(local_790 + (long)local_798));
          std::__cxx11::string::append((char *)local_678);
          puVar19 = (undefined8 *)
                    std::__cxx11::string::_M_append
                              ((char *)local_678,(ulong)local_7c0._M_dataplus._M_p);
          local_7e0._M_dataplus._M_p = (pointer)&local_7e0.field_2;
          puVar26 = puVar19 + 2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*puVar19 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)puVar26) {
            local_7e0.field_2._M_allocated_capacity = *puVar26;
            local_7e0.field_2._8_8_ = puVar19[3];
          }
          else {
            local_7e0.field_2._M_allocated_capacity = *puVar26;
            local_7e0._M_dataplus._M_p = (pointer)*puVar19;
          }
          local_7e0._M_string_length = puVar19[1];
          *puVar19 = puVar26;
          puVar19[1] = 0;
          *(undefined1 *)(puVar19 + 2) = 0;
          if (local_678 != (undefined1  [8])local_668) {
            operator_delete((void *)local_678);
          }
          DVar16 = IO::InquireVariableType(this_01,&local_7c0);
          switch(DVar16) {
          case Int8:
            variable = IO::InquireVariable<signed_char>(this_01,&local_7c0);
            DuplicateVariable<signed_char>
                      ((Variable<signed_char> *)local_678,this,variable,(this->super_Engine).m_IO,
                       &local_7e0,&local_748);
            Variable<signed_char>::~Variable((Variable<signed_char> *)local_678);
            break;
          case Int16:
            variable_08 = IO::InquireVariable<short>(this_01,&local_7c0);
            DuplicateVariable<short>
                      ((Variable<short> *)local_678,this,variable_08,(this->super_Engine).m_IO,
                       &local_7e0,&local_748);
            Variable<short>::~Variable((Variable<short> *)local_678);
            break;
          case Int32:
            variable_05 = IO::InquireVariable<int>(this_01,&local_7c0);
            DuplicateVariable<int>
                      ((Variable<int> *)local_678,this,variable_05,(this->super_Engine).m_IO,
                       &local_7e0,&local_748);
            Variable<int>::~Variable((Variable<int> *)local_678);
            break;
          case Int64:
            variable_06 = IO::InquireVariable<long>(this_01,&local_7c0);
            DuplicateVariable<long>
                      ((Variable<long> *)local_678,this,variable_06,(this->super_Engine).m_IO,
                       &local_7e0,&local_748);
            Variable<long>::~Variable((Variable<long> *)local_678);
            break;
          case UInt8:
            variable_02 = IO::InquireVariable<unsigned_char>(this_01,&local_7c0);
            DuplicateVariable<unsigned_char>
                      ((Variable<unsigned_char> *)local_678,this,variable_02,
                       (this->super_Engine).m_IO,&local_7e0,&local_748);
            Variable<unsigned_char>::~Variable((Variable<unsigned_char> *)local_678);
            break;
          case UInt16:
            variable_09 = IO::InquireVariable<unsigned_short>(this_01,&local_7c0);
            DuplicateVariable<unsigned_short>
                      ((Variable<unsigned_short> *)local_678,this,variable_09,
                       (this->super_Engine).m_IO,&local_7e0,&local_748);
            Variable<unsigned_short>::~Variable((Variable<unsigned_short> *)local_678);
            break;
          case UInt32:
            variable_11 = IO::InquireVariable<unsigned_int>(this_01,&local_7c0);
            DuplicateVariable<unsigned_int>
                      ((Variable<unsigned_int> *)local_678,this,variable_11,
                       (this->super_Engine).m_IO,&local_7e0,&local_748);
            Variable<unsigned_int>::~Variable((Variable<unsigned_int> *)local_678);
            break;
          case UInt64:
            variable_07 = IO::InquireVariable<unsigned_long>(this_01,&local_7c0);
            DuplicateVariable<unsigned_long>
                      ((Variable<unsigned_long> *)local_678,this,variable_07,
                       (this->super_Engine).m_IO,&local_7e0,&local_748);
            Variable<unsigned_long>::~Variable((Variable<unsigned_long> *)local_678);
            break;
          case Float:
            variable_13 = IO::InquireVariable<float>(this_01,&local_7c0);
            DuplicateVariable<float>
                      ((Variable<float> *)local_678,this,variable_13,(this->super_Engine).m_IO,
                       &local_7e0,&local_748);
            Variable<float>::~Variable((Variable<float> *)local_678);
            break;
          case Double:
            variable_04 = IO::InquireVariable<double>(this_01,&local_7c0);
            DuplicateVariable<double>
                      ((Variable<double> *)local_678,this,variable_04,(this->super_Engine).m_IO,
                       &local_7e0,&local_748);
            Variable<double>::~Variable((Variable<double> *)local_678);
            break;
          case LongDouble:
            variable_12 = IO::InquireVariable<long_double>(this_01,&local_7c0);
            DuplicateVariable<long_double>
                      ((Variable<long_double> *)local_678,this,variable_12,(this->super_Engine).m_IO
                       ,&local_7e0,&local_748);
            Variable<long_double>::~Variable((Variable<long_double> *)local_678);
            break;
          case FloatComplex:
            variable_01 = IO::InquireVariable<std::complex<float>>(this_01,&local_7c0);
            DuplicateVariable<std::complex<float>>
                      ((Variable<std::complex<float>_> *)local_678,this,variable_01,
                       (this->super_Engine).m_IO,&local_7e0,&local_748);
            Variable<std::complex<float>_>::~Variable((Variable<std::complex<float>_> *)local_678);
            break;
          case DoubleComplex:
            variable_03 = IO::InquireVariable<std::complex<double>>(this_01,&local_7c0);
            DuplicateVariable<std::complex<double>>
                      ((Variable<std::complex<double>_> *)local_678,this,variable_03,
                       (this->super_Engine).m_IO,&local_7e0,&local_748);
            Variable<std::complex<double>_>::~Variable((Variable<std::complex<double>_> *)local_678)
            ;
            break;
          case String:
            variable_10 = IO::InquireVariable<std::__cxx11::string>(this_01,&local_7c0);
            DuplicateVariable<std::__cxx11::string>
                      ((Variable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)local_678,this,variable_10,(this->super_Engine).m_IO,&local_7e0,&local_748
                      );
            Variable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::~Variable((Variable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         *)local_678);
            break;
          case Char:
            variable_00 = IO::InquireVariable<char>(this_01,&local_7c0);
            DuplicateVariable<char>
                      ((Variable<char> *)local_678,this,variable_00,(this->super_Engine).m_IO,
                       &local_7e0,&local_748);
            Variable<char>::~Variable((Variable<char> *)local_678);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_7e0._M_dataplus._M_p != &local_7e0.field_2) {
            operator_delete(local_7e0._M_dataplus._M_p);
          }
          if (local_798 != &local_788) {
            operator_delete(local_798);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_7c0._M_dataplus._M_p != &local_7c0.field_2) {
            operator_delete(local_7c0._M_dataplus._M_p);
          }
        }
        for (; p_Var24 != (_Rb_tree_node_base *)(local_708 + 8);
            p_Var24 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var24)) {
          local_7c0._M_dataplus._M_p = (pointer)&local_7c0.field_2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_7c0,*(long *)(p_Var24 + 1),
                     (long)&(p_Var24[1]._M_parent)->_M_color + *(long *)(p_Var24 + 1));
          local_798 = &local_788;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_798,p_Var25[2]._M_parent,
                     (long)&(p_Var25[2]._M_left)->_M_color + (long)p_Var25[2]._M_parent);
          local_678 = (undefined1  [8])local_668;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)local_678,local_798,(undefined1 *)(local_790 + (long)local_798));
          std::__cxx11::string::append((char *)local_678);
          puVar19 = (undefined8 *)
                    std::__cxx11::string::_M_append
                              ((char *)local_678,(ulong)local_7c0._M_dataplus._M_p);
          local_7e0._M_dataplus._M_p = (pointer)&local_7e0.field_2;
          puVar26 = puVar19 + 2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*puVar19 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)puVar26) {
            local_7e0.field_2._M_allocated_capacity = *puVar26;
            local_7e0.field_2._8_8_ = puVar19[3];
          }
          else {
            local_7e0.field_2._M_allocated_capacity = *puVar26;
            local_7e0._M_dataplus._M_p = (pointer)*puVar19;
          }
          local_7e0._M_string_length = puVar19[1];
          *puVar19 = puVar26;
          puVar19[1] = 0;
          *(undefined1 *)(puVar19 + 2) = 0;
          if (local_678 != (undefined1  [8])local_668) {
            operator_delete((void *)local_678);
          }
          local_678 = (undefined1  [8])local_668;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_678,"");
          local_2d0._M_dataplus._M_p = (pointer)&local_2d0.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_2d0,"/","");
          DVar16 = IO::InquireAttributeType(this_01,&local_7c0,(string *)local_678,&local_2d0);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_2d0._M_dataplus._M_p != &local_2d0.field_2) {
            operator_delete(local_2d0._M_dataplus._M_p);
          }
          if (local_678 != (undefined1  [8])local_668) {
            operator_delete((void *)local_678);
          }
          switch(DVar16) {
          case Int8:
            local_678 = (undefined1  [8])local_668;
            std::__cxx11::string::_M_construct<char_const*>((string *)local_678,"");
            local_130._M_dataplus._M_p = (pointer)&local_130.field_2;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_130,"/","");
            attribute = IO::InquireAttribute<signed_char>
                                  (this_01,&local_7c0,(string *)local_678,&local_130);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_130._M_dataplus._M_p != &local_130.field_2) {
              operator_delete(local_130._M_dataplus._M_p);
            }
            if (local_678 != (undefined1  [8])local_668) {
              operator_delete((void *)local_678);
            }
            DuplicateAttribute<signed_char>
                      ((Attribute<signed_char> *)local_678,this,attribute,(this->super_Engine).m_IO,
                       &local_7e0);
            Attribute<signed_char>::~Attribute((Attribute<signed_char> *)local_678);
            break;
          case Int16:
            local_678 = (undefined1  [8])local_668;
            std::__cxx11::string::_M_construct<char_const*>((string *)local_678,"");
            local_150._M_dataplus._M_p = (pointer)&local_150.field_2;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_150,"/","");
            attribute_08 = IO::InquireAttribute<short>
                                     (this_01,&local_7c0,(string *)local_678,&local_150);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_150._M_dataplus._M_p != &local_150.field_2) {
              operator_delete(local_150._M_dataplus._M_p);
            }
            if (local_678 != (undefined1  [8])local_668) {
              operator_delete((void *)local_678);
            }
            DuplicateAttribute<short>
                      ((Attribute<short> *)local_678,this,attribute_08,(this->super_Engine).m_IO,
                       &local_7e0);
            Attribute<short>::~Attribute((Attribute<short> *)local_678);
            break;
          case Int32:
            local_678 = (undefined1  [8])local_668;
            std::__cxx11::string::_M_construct<char_const*>((string *)local_678,"");
            local_170._M_dataplus._M_p = (pointer)&local_170.field_2;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_170,"/","");
            attribute_05 = IO::InquireAttribute<int>
                                     (this_01,&local_7c0,(string *)local_678,&local_170);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_170._M_dataplus._M_p != &local_170.field_2) {
              operator_delete(local_170._M_dataplus._M_p);
            }
            if (local_678 != (undefined1  [8])local_668) {
              operator_delete((void *)local_678);
            }
            DuplicateAttribute<int>
                      ((Attribute<int> *)local_678,this,attribute_05,(this->super_Engine).m_IO,
                       &local_7e0);
            Attribute<int>::~Attribute((Attribute<int> *)local_678);
            break;
          case Int64:
            local_678 = (undefined1  [8])local_668;
            std::__cxx11::string::_M_construct<char_const*>((string *)local_678,"");
            local_190._M_dataplus._M_p = (pointer)&local_190.field_2;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_190,"/","");
            attribute_06 = IO::InquireAttribute<long>
                                     (this_01,&local_7c0,(string *)local_678,&local_190);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_190._M_dataplus._M_p != &local_190.field_2) {
              operator_delete(local_190._M_dataplus._M_p);
            }
            if (local_678 != (undefined1  [8])local_668) {
              operator_delete((void *)local_678);
            }
            DuplicateAttribute<long>
                      ((Attribute<long> *)local_678,this,attribute_06,(this->super_Engine).m_IO,
                       &local_7e0);
            Attribute<long>::~Attribute((Attribute<long> *)local_678);
            break;
          case UInt8:
            local_678 = (undefined1  [8])local_668;
            std::__cxx11::string::_M_construct<char_const*>((string *)local_678,"");
            local_1b0._M_dataplus._M_p = (pointer)&local_1b0.field_2;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_1b0,"/","");
            attribute_02 = IO::InquireAttribute<unsigned_char>
                                     (this_01,&local_7c0,(string *)local_678,&local_1b0);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_1b0._M_dataplus._M_p != &local_1b0.field_2) {
              operator_delete(local_1b0._M_dataplus._M_p);
            }
            if (local_678 != (undefined1  [8])local_668) {
              operator_delete((void *)local_678);
            }
            DuplicateAttribute<unsigned_char>
                      ((Attribute<unsigned_char> *)local_678,this,attribute_02,
                       (this->super_Engine).m_IO,&local_7e0);
            Attribute<unsigned_char>::~Attribute((Attribute<unsigned_char> *)local_678);
            break;
          case UInt16:
            local_678 = (undefined1  [8])local_668;
            std::__cxx11::string::_M_construct<char_const*>((string *)local_678,"");
            local_1d0._M_dataplus._M_p = (pointer)&local_1d0.field_2;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_1d0,"/","");
            attribute_09 = IO::InquireAttribute<unsigned_short>
                                     (this_01,&local_7c0,(string *)local_678,&local_1d0);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_1d0._M_dataplus._M_p != &local_1d0.field_2) {
              operator_delete(local_1d0._M_dataplus._M_p);
            }
            if (local_678 != (undefined1  [8])local_668) {
              operator_delete((void *)local_678);
            }
            DuplicateAttribute<unsigned_short>
                      ((Attribute<unsigned_short> *)local_678,this,attribute_09,
                       (this->super_Engine).m_IO,&local_7e0);
            Attribute<unsigned_short>::~Attribute((Attribute<unsigned_short> *)local_678);
            break;
          case UInt32:
            local_678 = (undefined1  [8])local_668;
            std::__cxx11::string::_M_construct<char_const*>((string *)local_678,"");
            local_1f0._M_dataplus._M_p = (pointer)&local_1f0.field_2;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_1f0,"/","");
            attribute_11 = IO::InquireAttribute<unsigned_int>
                                     (this_01,&local_7c0,(string *)local_678,&local_1f0);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_1f0._M_dataplus._M_p != &local_1f0.field_2) {
              operator_delete(local_1f0._M_dataplus._M_p);
            }
            if (local_678 != (undefined1  [8])local_668) {
              operator_delete((void *)local_678);
            }
            DuplicateAttribute<unsigned_int>
                      ((Attribute<unsigned_int> *)local_678,this,attribute_11,
                       (this->super_Engine).m_IO,&local_7e0);
            Attribute<unsigned_int>::~Attribute((Attribute<unsigned_int> *)local_678);
            break;
          case UInt64:
            local_678 = (undefined1  [8])local_668;
            std::__cxx11::string::_M_construct<char_const*>((string *)local_678,"");
            local_210._M_dataplus._M_p = (pointer)&local_210.field_2;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_210,"/","");
            attribute_07 = IO::InquireAttribute<unsigned_long>
                                     (this_01,&local_7c0,(string *)local_678,&local_210);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_210._M_dataplus._M_p != &local_210.field_2) {
              operator_delete(local_210._M_dataplus._M_p);
            }
            if (local_678 != (undefined1  [8])local_668) {
              operator_delete((void *)local_678);
            }
            DuplicateAttribute<unsigned_long>
                      ((Attribute<unsigned_long> *)local_678,this,attribute_07,
                       (this->super_Engine).m_IO,&local_7e0);
            Attribute<unsigned_long>::~Attribute((Attribute<unsigned_long> *)local_678);
            break;
          case Float:
            local_678 = (undefined1  [8])local_668;
            std::__cxx11::string::_M_construct<char_const*>((string *)local_678,"");
            local_230._M_dataplus._M_p = (pointer)&local_230.field_2;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_230,"/","");
            attribute_13 = IO::InquireAttribute<float>
                                     (this_01,&local_7c0,(string *)local_678,&local_230);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_230._M_dataplus._M_p != &local_230.field_2) {
              operator_delete(local_230._M_dataplus._M_p);
            }
            if (local_678 != (undefined1  [8])local_668) {
              operator_delete((void *)local_678);
            }
            DuplicateAttribute<float>
                      ((Attribute<float> *)local_678,this,attribute_13,(this->super_Engine).m_IO,
                       &local_7e0);
            Attribute<float>::~Attribute((Attribute<float> *)local_678);
            break;
          case Double:
            local_678 = (undefined1  [8])local_668;
            std::__cxx11::string::_M_construct<char_const*>((string *)local_678,"");
            local_250._M_dataplus._M_p = (pointer)&local_250.field_2;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_250,"/","");
            attribute_04 = IO::InquireAttribute<double>
                                     (this_01,&local_7c0,(string *)local_678,&local_250);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_250._M_dataplus._M_p != &local_250.field_2) {
              operator_delete(local_250._M_dataplus._M_p);
            }
            if (local_678 != (undefined1  [8])local_668) {
              operator_delete((void *)local_678);
            }
            DuplicateAttribute<double>
                      ((Attribute<double> *)local_678,this,attribute_04,(this->super_Engine).m_IO,
                       &local_7e0);
            Attribute<double>::~Attribute((Attribute<double> *)local_678);
            break;
          case LongDouble:
            local_678 = (undefined1  [8])local_668;
            std::__cxx11::string::_M_construct<char_const*>((string *)local_678,"");
            local_270._M_dataplus._M_p = (pointer)&local_270.field_2;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_270,"/","");
            attribute_12 = IO::InquireAttribute<long_double>
                                     (this_01,&local_7c0,(string *)local_678,&local_270);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_270._M_dataplus._M_p != &local_270.field_2) {
              operator_delete(local_270._M_dataplus._M_p);
            }
            if (local_678 != (undefined1  [8])local_668) {
              operator_delete((void *)local_678);
            }
            DuplicateAttribute<long_double>
                      ((Attribute<long_double> *)local_678,this,attribute_12,
                       (this->super_Engine).m_IO,&local_7e0);
            Attribute<long_double>::~Attribute((Attribute<long_double> *)local_678);
            break;
          case FloatComplex:
            local_678 = (undefined1  [8])local_668;
            std::__cxx11::string::_M_construct<char_const*>((string *)local_678,"");
            local_290._M_dataplus._M_p = (pointer)&local_290.field_2;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_290,"/","");
            attribute_01 = IO::InquireAttribute<std::complex<float>>
                                     (this_01,&local_7c0,(string *)local_678,&local_290);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_290._M_dataplus._M_p != &local_290.field_2) {
              operator_delete(local_290._M_dataplus._M_p);
            }
            if (local_678 != (undefined1  [8])local_668) {
              operator_delete((void *)local_678);
            }
            DuplicateAttribute<std::complex<float>>
                      ((Attribute<std::complex<float>_> *)local_678,this,attribute_01,
                       (this->super_Engine).m_IO,&local_7e0);
            Attribute<std::complex<float>_>::~Attribute
                      ((Attribute<std::complex<float>_> *)local_678);
            break;
          case DoubleComplex:
            local_678 = (undefined1  [8])local_668;
            std::__cxx11::string::_M_construct<char_const*>((string *)local_678,"");
            local_2b0._M_dataplus._M_p = (pointer)&local_2b0.field_2;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_2b0,"/","");
            attribute_03 = IO::InquireAttribute<std::complex<double>>
                                     (this_01,&local_7c0,(string *)local_678,&local_2b0);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_2b0._M_dataplus._M_p != &local_2b0.field_2) {
              operator_delete(local_2b0._M_dataplus._M_p);
            }
            if (local_678 != (undefined1  [8])local_668) {
              operator_delete((void *)local_678);
            }
            DuplicateAttribute<std::complex<double>>
                      ((Attribute<std::complex<double>_> *)local_678,this,attribute_03,
                       (this->super_Engine).m_IO,&local_7e0);
            Attribute<std::complex<double>_>::~Attribute
                      ((Attribute<std::complex<double>_> *)local_678);
            break;
          case String:
            local_678 = (undefined1  [8])local_668;
            std::__cxx11::string::_M_construct<char_const*>((string *)local_678,"");
            local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_f0,"/","");
            attribute_10 = IO::InquireAttribute<std::__cxx11::string>
                                     (this_01,&local_7c0,(string *)local_678,&local_f0);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
              operator_delete(local_f0._M_dataplus._M_p);
            }
            if (local_678 != (undefined1  [8])local_668) {
              operator_delete((void *)local_678);
            }
            DuplicateAttribute<std::__cxx11::string>
                      ((Attribute<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)local_678,this,attribute_10,(this->super_Engine).m_IO,&local_7e0);
            Attribute<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::~Attribute((Attribute<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)local_678);
            break;
          case Char:
            local_678 = (undefined1  [8])local_668;
            std::__cxx11::string::_M_construct<char_const*>((string *)local_678,"");
            local_110._M_dataplus._M_p = (pointer)&local_110.field_2;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_110,"/","");
            attribute_00 = IO::InquireAttribute<char>
                                     (this_01,&local_7c0,(string *)local_678,&local_110);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_110._M_dataplus._M_p != &local_110.field_2) {
              operator_delete(local_110._M_dataplus._M_p);
            }
            if (local_678 != (undefined1  [8])local_668) {
              operator_delete((void *)local_678);
            }
            DuplicateAttribute<char>
                      ((Attribute<char> *)local_678,this,attribute_00,(this->super_Engine).m_IO,
                       &local_7e0);
            Attribute<char>::~Attribute((Attribute<char> *)local_678);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_7e0._M_dataplus._M_p != &local_7e0.field_2) {
            operator_delete(local_7e0._M_dataplus._M_p);
          }
          if (local_798 != &local_788) {
            operator_delete(local_798);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_7c0._M_dataplus._M_p != &local_7c0.field_2) {
            operator_delete(local_7c0._M_dataplus._M_p);
          }
        }
        std::
        _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>_>
        ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>_>
                     *)local_708);
        std::
        _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>_>
        ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>_>
                     *)local_778);
      }
      else {
        cVar22 = std::
                 _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<adios2::HostConfig,_std::allocator<adios2::HostConfig>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<adios2::HostConfig,_std::allocator<adios2::HostConfig>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<adios2::HostConfig,_std::allocator<adios2::HostConfig>_>_>_>_>
                 ::find(&((this->super_Engine).m_HostOptions)->_M_t,&pCVar35->hostname);
        if (((_Rb_tree_header *)cVar22._M_node ==
             &(((this->super_Engine).m_HostOptions)->_M_t)._M_impl.super__Rb_tree_header) ||
           (lVar37 = *(long *)(cVar22._M_node + 2), *(int *)(lVar37 + 0x20) != 3)) {
          pbVar6 = (this->m_CampaignData).directory.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          local_678 = (undefined1  [8])local_668;
          pcVar3 = pbVar6[(long)p_Var25[3]._M_left]._M_dataplus._M_p;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)local_678,pcVar3,
                     pcVar3 + pbVar6[(long)p_Var25[3]._M_left]._M_string_length);
          std::__cxx11::string::_M_replace_aux((ulong)local_678,(ulong)_Stack_670._M_p,0,'\x01');
          plVar17 = (long *)std::__cxx11::string::_M_append
                                      ((char *)local_678,(ulong)p_Var25[2]._M_parent);
          local_778._0_8_ = local_778 + 0x10;
          psVar27 = (size_type *)(plVar17 + 2);
          if ((size_type *)*plVar17 == psVar27) {
            local_778._16_8_ = *psVar27;
            local_778._24_8_ = plVar17[3];
          }
          else {
            local_778._16_8_ = *psVar27;
            local_778._0_8_ = (size_type *)*plVar17;
          }
          local_778._8_8_ = plVar17[1];
          *plVar17 = (long)psVar27;
          plVar17[1] = 0;
          *(undefined1 *)(plVar17 + 2) = 0;
          if (local_678 != (undefined1  [8])local_668) {
            operator_delete((void *)local_678);
          }
          pCVar35 = (this->m_CampaignData).hosts.
                    super__Vector_base<adios2::core::engine::CampaignHost,_std::allocator<adios2::core::engine::CampaignHost>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          local_678 = (undefined1  [8])local_668;
          _Var9._M_p = pCVar35[(long)p_Var25[3]._M_parent].hostname._M_dataplus._M_p;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)local_678,_Var9._M_p,
                     _Var9._M_p + pCVar35[(long)p_Var25[3]._M_parent].hostname._M_string_length);
          std::__cxx11::string::append((char *)local_678);
          puVar19 = (undefined8 *)std::__cxx11::string::_M_append((char *)local_678,local_778._0_8_)
          ;
          local_708._0_8_ = local_708 + 0x10;
          psVar27 = puVar19 + 2;
          if ((size_type *)*puVar19 == psVar27) {
            local_708._16_8_ = *psVar27;
            local_708._24_8_ = puVar19[3];
          }
          else {
            local_708._16_8_ = *psVar27;
            local_708._0_8_ = (size_type *)*puVar19;
          }
          local_708._8_8_ = puVar19[1];
          *puVar19 = psVar27;
          puVar19[1] = 0;
          *(undefined1 *)(puVar19 + 2) = 0;
          if (local_678 != (undefined1  [8])local_668) {
            operator_delete((void *)local_678);
          }
          local_7e0._M_dataplus._M_p = (pointer)&local_7e0.field_2;
          pcVar3 = (this->m_Options).cachepath._M_dataplus._M_p;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_7e0,pcVar3,
                     pcVar3 + (this->m_Options).cachepath._M_string_length);
          std::__cxx11::string::_M_replace_aux
                    ((ulong)&local_7e0,local_7e0._M_string_length,0,'\x01');
          std::__cxx11::string::substr((ulong)&local_748,(ulong)&p_Var25[1]._M_parent);
          uVar33 = 0xf;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_7e0._M_dataplus._M_p != &local_7e0.field_2) {
            uVar33 = local_7e0.field_2._M_allocated_capacity;
          }
          if ((ulong)uVar33 < local_748.ioIdx + local_7e0._M_string_length) {
            uVar36 = 0xf;
            if ((size_t *)local_748.originalVar != &local_748.engineIdx) {
              uVar36 = local_748.engineIdx;
            }
            if (uVar36 < local_748.ioIdx + local_7e0._M_string_length) goto LAB_0065ffbb;
            puVar19 = (undefined8 *)
                      std::__cxx11::string::replace
                                ((ulong)&local_748,0,(char *)0x0,(ulong)local_7e0._M_dataplus._M_p);
          }
          else {
LAB_0065ffbb:
            puVar19 = (undefined8 *)
                      std::__cxx11::string::_M_append
                                ((char *)&local_7e0,(ulong)local_748.originalVar);
          }
          local_798 = &local_788;
          plVar17 = puVar19 + 2;
          if ((long *)*puVar19 == plVar17) {
            local_788 = *plVar17;
            lStack_780 = puVar19[3];
          }
          else {
            local_788 = *plVar17;
            local_798 = (long *)*puVar19;
          }
          local_790 = puVar19[1];
          *puVar19 = plVar17;
          puVar19[1] = 0;
          *(undefined1 *)plVar17 = 0;
          plVar17 = (long *)std::__cxx11::string::_M_replace_aux
                                      ((ulong)&local_798,local_790,0,'\x01');
          local_7c0._M_dataplus._M_p = (pointer)&local_7c0.field_2;
          puVar26 = (ulong *)(plVar17 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar17 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)puVar26) {
            local_7c0.field_2._M_allocated_capacity = *puVar26;
            local_7c0.field_2._8_8_ = plVar17[3];
          }
          else {
            local_7c0.field_2._M_allocated_capacity = *puVar26;
            local_7c0._M_dataplus._M_p = (pointer)*plVar17;
          }
          local_7c0._M_string_length = plVar17[1];
          *plVar17 = (long)puVar26;
          plVar17[1] = 0;
          *(undefined1 *)(plVar17 + 2) = 0;
          puVar19 = (undefined8 *)
                    std::__cxx11::string::_M_append((char *)&local_7c0,(ulong)p_Var25[1]._M_parent);
          puVar26 = puVar19 + 2;
          if ((ulong *)*puVar19 == puVar26) {
            local_668._0_8_ = *puVar26;
            local_668._8_8_ = puVar19[3];
            local_678 = (undefined1  [8])local_668;
          }
          else {
            local_668._0_8_ = *puVar26;
            local_678 = (undefined1  [8])*puVar19;
          }
          _Stack_670._M_p = (pointer)puVar19[1];
          *puVar19 = puVar26;
          puVar19[1] = 0;
          *(undefined1 *)(puVar19 + 2) = 0;
          std::__cxx11::string::operator=((string *)&local_728,(string *)local_678);
          if (local_678 != (undefined1  [8])local_668) {
            operator_delete((void *)local_678);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_7c0._M_dataplus._M_p != &local_7c0.field_2) {
            operator_delete(local_7c0._M_dataplus._M_p);
          }
          if (local_798 != &local_788) {
            operator_delete(local_798);
          }
          if ((size_t *)local_748.originalVar != &local_748.engineIdx) {
            operator_delete(local_748.originalVar);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_7e0._M_dataplus._M_p != &local_7e0.field_2) {
            operator_delete(local_7e0._M_dataplus._M_p);
          }
          if (0 < (this->m_Options).verbose) {
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cout,"Open remote file ",0x11);
            poVar20 = std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)&std::cout,(char *)local_708._0_8_,local_708._8_8_);
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar20,"\n    and use local cache for metadata at ",0x29);
            poVar20 = std::__ostream_insert<char,std::char_traits<char>>
                                (poVar20,local_728._M_dataplus._M_p,local_728._M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>(poVar20," \n",2);
          }
          helper::CreateDirectory(&local_728);
          local_7c0._M_dataplus._M_p = (pointer)&local_7c0.field_2;
          local_7c0._M_string_length = 0;
          local_7c0.field_2._M_allocated_capacity =
               local_7c0.field_2._M_allocated_capacity & 0xffffffffffffff00;
          if (*(char *)&p_Var25[3]._M_right == '\x01') {
            if (0 < (this->m_Options).verbose) {
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cout,"The dataset is key protected with key id ",0x29);
              pCVar32 = (this->m_CampaignData).keys.
                        super__Vector_base<adios2::core::engine::CampaignKey,_std::allocator<adios2::core::engine::CampaignKey>_>
                        ._M_impl.super__Vector_impl_data._M_start;
              poVar20 = std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)&std::cout,
                                   pCVar32[*(long *)(p_Var25 + 4)].id._M_dataplus._M_p,
                                   pCVar32[*(long *)(p_Var25 + 4)].id._M_string_length);
              std::__ostream_insert<char,std::char_traits<char>>(poVar20,"\n",1);
            }
            if ((this->m_CampaignData).keys.
                super__Vector_base<adios2::core::engine::CampaignKey,_std::allocator<adios2::core::engine::CampaignKey>_>
                ._M_impl.super__Vector_impl_data._M_start[*(long *)(p_Var25 + 4)].keyHex.
                _M_string_length == 0) {
              if (this_02 == (Remote *)0x0) {
                this_02 = (Remote *)operator_new(0x20);
                hostOptions = ADIOS::StaticGetHostOptions_abi_cxx11_();
                Remote::Remote(this_02,hostOptions);
              }
              pCVar32 = (this->m_CampaignData).keys.
                        super__Vector_base<adios2::core::engine::CampaignKey,_std::allocator<adios2::core::engine::CampaignKey>_>
                        ._M_impl.super__Vector_impl_data._M_start;
              local_310._M_dataplus._M_p = (pointer)&local_310.field_2;
              _Var9._M_p = pCVar32[*(long *)(p_Var25 + 4)].id._M_dataplus._M_p;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)&local_310,_Var9._M_p,
                         _Var9._M_p + pCVar32[*(long *)(p_Var25 + 4)].id._M_string_length);
              Remote::GetKeyFromConnectionManager((string *)local_678,this_02,&local_310);
              std::__cxx11::string::operator=
                        ((string *)
                         &(this->m_CampaignData).keys.
                          super__Vector_base<adios2::core::engine::CampaignKey,_std::allocator<adios2::core::engine::CampaignKey>_>
                          ._M_impl.super__Vector_impl_data._M_start[*(long *)(p_Var25 + 4)].keyHex,
                         (string *)local_678);
              if (local_678 != (undefined1  [8])local_668) {
                operator_delete((void *)local_678);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_310._M_dataplus._M_p != &local_310.field_2) {
                operator_delete(local_310._M_dataplus._M_p);
              }
              if (0 < (this->m_Options).verbose) {
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cout,"-- Received key ",0x10);
                pCVar32 = (this->m_CampaignData).keys.
                          super__Vector_base<adios2::core::engine::CampaignKey,_std::allocator<adios2::core::engine::CampaignKey>_>
                          ._M_impl.super__Vector_impl_data._M_start;
                poVar20 = std::__ostream_insert<char,std::char_traits<char>>
                                    ((ostream *)&std::cout,
                                     pCVar32[*(long *)(p_Var25 + 4)].keyHex._M_dataplus._M_p,
                                     pCVar32[*(long *)(p_Var25 + 4)].keyHex._M_string_length);
                std::__ostream_insert<char,std::char_traits<char>>(poVar20,"\n",1);
              }
            }
            iVar14 = std::__cxx11::string::compare
                               ((char *)&(this->m_CampaignData).keys.
                                         super__Vector_base<adios2::core::engine::CampaignKey,_std::allocator<adios2::core::engine::CampaignKey>_>
                                         ._M_impl.super__Vector_impl_data._M_start
                                         [*(long *)(p_Var25 + 4)].keyHex);
            if (iVar14 != 0) {
              std::__cxx11::string::_M_assign((string *)&local_7c0);
              goto LAB_0066043e;
            }
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cerr,"ERROR: don\'t have the key ",0x1a);
            pCVar32 = (this->m_CampaignData).keys.
                      super__Vector_base<adios2::core::engine::CampaignKey,_std::allocator<adios2::core::engine::CampaignKey>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            poVar20 = std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)&std::cerr,
                                 pCVar32[*(long *)(p_Var25 + 4)].id._M_dataplus._M_p,
                                 pCVar32[*(long *)(p_Var25 + 4)].id._M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>(poVar20," to decrypt ",0xc);
            poVar20 = std::__ostream_insert<char,std::char_traits<char>>
                                (poVar20,(char *)p_Var25[2]._M_parent,(long)p_Var25[2]._M_left);
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar20,". Ignoring this dataset.",0x18);
            std::ios::widen((char)*(undefined8 *)(*(long *)poVar20 + -0x18) + (char)poVar20);
            std::ostream::put((char)poVar20);
            std::ostream::flush();
            bVar12 = false;
          }
          else {
LAB_0066043e:
            pCVar10 = (CampaignBPFile *)p_Var25[4]._M_left;
            local_7a0 = this_02;
            for (bpfile = (CampaignBPFile *)p_Var25[4]._M_parent; bpfile != pCVar10;
                bpfile = bpfile + 1) {
              db = *local_6d0;
              local_798 = &local_788;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)&local_798,local_728._M_dataplus._M_p,
                         local_728._M_dataplus._M_p + local_728._M_string_length);
              std::__cxx11::string::_M_replace_aux((ulong)&local_798,local_790,0,'\x01');
              puVar19 = (undefined8 *)
                        std::__cxx11::string::_M_append
                                  ((char *)&local_798,(ulong)(bpfile->name)._M_dataplus._M_p);
              local_678 = (undefined1  [8])local_668;
              puVar26 = puVar19 + 2;
              if ((ulong *)*puVar19 == puVar26) {
                local_668._0_8_ = *puVar26;
                local_668._8_8_ = puVar19[3];
              }
              else {
                local_668._0_8_ = *puVar26;
                local_678 = (undefined1  [8])*puVar19;
              }
              _Stack_670._M_p = (pointer)puVar19[1];
              *puVar19 = puVar26;
              puVar19[1] = 0;
              *(undefined1 *)(puVar19 + 2) = 0;
              SaveToFile(db,(string *)local_678,bpfile,&local_7c0);
              if (local_678 != (undefined1  [8])local_668) {
                operator_delete((void *)local_678);
              }
              if (local_798 != &local_788) {
                operator_delete(local_798);
              }
            }
            local_330._M_dataplus._M_p = (pointer)&local_330.field_2;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_330,"RemoteDataPath","");
            this_02 = local_7a0;
            local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_70,local_778._0_8_,
                       (char *)(local_778._0_8_ + local_778._8_8_));
            IO::SetParameter(this_01,&local_330,&local_70);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_70._M_dataplus._M_p != &local_70.field_2) {
              operator_delete(local_70._M_dataplus._M_p);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_330._M_dataplus._M_p != &local_330.field_2) {
              operator_delete(local_330._M_dataplus._M_p);
            }
            local_350._M_dataplus._M_p = (pointer)&local_350.field_2;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_350,"RemoteHost","");
            pCVar35 = (this->m_CampaignData).hosts.
                      super__Vector_base<adios2::core::engine::CampaignHost,_std::allocator<adios2::core::engine::CampaignHost>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            _Var9._M_p = pCVar35[(long)p_Var25[3]._M_parent].hostname._M_dataplus._M_p;
            local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_90,_Var9._M_p,
                       _Var9._M_p + pCVar35[(long)p_Var25[3]._M_parent].hostname._M_string_length);
            IO::SetParameter(this_01,&local_350,&local_90);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_90._M_dataplus._M_p != &local_90.field_2) {
              operator_delete(local_90._M_dataplus._M_p);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_350._M_dataplus._M_p != &local_350.field_2) {
              operator_delete(local_350._M_dataplus._M_p);
            }
            local_370._M_dataplus._M_p = (pointer)&local_370.field_2;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_370,"UUID","");
            local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_b0,p_Var25[1]._M_parent,
                       (long)&(p_Var25[1]._M_left)->_M_color + (long)p_Var25[1]._M_parent);
            IO::SetParameter(this_01,&local_370,&local_b0);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
              operator_delete(local_b0._M_dataplus._M_p);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_370._M_dataplus._M_p != &local_370.field_2) {
              operator_delete(local_370._M_dataplus._M_p);
            }
            local_7e0._M_dataplus._M_p = (pointer)&local_7e0.field_2;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_7e0,local_728._M_dataplus._M_p,
                       local_728._M_dataplus._M_p + local_728._M_string_length);
            std::__cxx11::string::_M_replace_aux
                      ((ulong)&local_7e0,local_7e0._M_string_length,0,'\x01');
            puVar19 = (undefined8 *)std::__cxx11::string::append((char *)&local_7e0);
            local_798 = &local_788;
            plVar17 = puVar19 + 2;
            if ((long *)*puVar19 == plVar17) {
              local_788 = *plVar17;
              lStack_780 = puVar19[3];
            }
            else {
              local_788 = *plVar17;
              local_798 = (long *)*puVar19;
            }
            local_790 = puVar19[1];
            *puVar19 = plVar17;
            puVar19[1] = 0;
            *(undefined1 *)(puVar19 + 2) = 0;
            std::ofstream::ofstream
                      ((Variable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)local_678,(string *)&local_798,_S_out);
            if (local_798 != &local_788) {
              operator_delete(local_798);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_7e0._M_dataplus._M_p != &local_7e0.field_2) {
              operator_delete(local_7e0._M_dataplus._M_p);
            }
            cVar13 = std::__basic_file<char>::is_open();
            if (cVar13 != '\0') {
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_678,"Campaign = ",0xb);
              poVar20 = std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)local_678,(this->super_Engine).m_Name._M_dataplus._M_p
                                   ,(this->super_Engine).m_Name._M_string_length);
              std::__ostream_insert<char,std::char_traits<char>>(poVar20,"\n",1);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_678,"Dataset = ",10);
              poVar20 = std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)local_678,(char *)p_Var25[2]._M_parent,
                                   (long)p_Var25[2]._M_left);
              std::__ostream_insert<char,std::char_traits<char>>(poVar20,"\n",1);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_678,"RemoteHost = ",0xd);
              pCVar35 = (this->m_CampaignData).hosts.
                        super__Vector_base<adios2::core::engine::CampaignHost,_std::allocator<adios2::core::engine::CampaignHost>_>
                        ._M_impl.super__Vector_impl_data._M_start;
              poVar20 = std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)local_678,
                                   pCVar35[(long)p_Var25[3]._M_parent].hostname._M_dataplus._M_p,
                                   pCVar35[(long)p_Var25[3]._M_parent].hostname._M_string_length);
              std::__ostream_insert<char,std::char_traits<char>>(poVar20,"\n",1);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_678,"RemoteDataPath = ",0x11);
              poVar20 = std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)local_678,(char *)local_778._0_8_,local_778._8_8_);
              std::__ostream_insert<char,std::char_traits<char>>(poVar20,"\n",1);
              std::ofstream::close();
            }
            local_678 = (undefined1  [8])local_388;
            *(undefined8 *)(local_678 + local_388[-3]) = local_390;
            std::filebuf::~filebuf((filebuf *)&_Stack_670);
            std::ios_base::~ios_base(local_580);
            bVar12 = true;
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_7c0._M_dataplus._M_p != &local_7c0.field_2) {
            operator_delete(local_7c0._M_dataplus._M_p);
          }
          if ((undefined1 *)local_708._0_8_ != local_708 + 0x10) {
            operator_delete((void *)local_708._0_8_);
          }
          if ((undefined1 *)local_778._0_8_ != local_778 + 0x10) {
            operator_delete((void *)local_778._0_8_);
          }
        }
        else {
          local_778._0_8_ = local_778 + 0x10;
          local_6d8 = lVar37;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)local_778,*(long *)(lVar37 + 0x90),
                     *(long *)(lVar37 + 0x98) + *(long *)(lVar37 + 0x90));
          pbVar6 = (this->m_CampaignData).directory.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          local_678 = (undefined1  [8])local_668;
          pcVar3 = pbVar6[(long)p_Var25[3]._M_left]._M_dataplus._M_p;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)local_678,pcVar3,
                     pcVar3 + pbVar6[(long)p_Var25[3]._M_left]._M_string_length);
          std::__cxx11::string::append((char *)local_678);
          plVar17 = (long *)std::__cxx11::string::_M_append
                                      ((char *)local_678,(ulong)p_Var25[2]._M_parent);
          psVar27 = (size_type *)(plVar17 + 2);
          if ((size_type *)*plVar17 == psVar27) {
            local_708._16_8_ = *psVar27;
            local_708._24_8_ = plVar17[3];
            local_708._0_8_ = local_708 + 0x10;
          }
          else {
            local_708._16_8_ = *psVar27;
            local_708._0_8_ = (size_type *)*plVar17;
          }
          local_708._8_8_ = plVar17[1];
          *plVar17 = (long)psVar27;
          plVar17[1] = 0;
          *(undefined1 *)(plVar17 + 2) = 0;
          if (local_678 != (undefined1  [8])local_668) {
            operator_delete((void *)local_678);
          }
          _Stack_670._M_p = _Stack_670._M_p & 0xffffffff00000000;
          local_668._0_8_ = 0;
          local_668._8_8_ = &_Stack_670;
          uStack_650._0_4_ = None;
          uStack_650._4_4_ = 0;
          local_668._16_8_ = local_668._8_8_;
          std::
          _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
          ::_M_emplace_unique<char_const(&)[8],char_const(&)[7]>
                    ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                      *)local_678,(char (*) [8])0x757640,(char (*) [7])"awssdk");
          std::
          _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
          ::_M_emplace_unique<char_const(&)[9],std::__cxx11::string_const&>
                    ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                      *)local_678,(char (*) [9])"endpoint",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_778)
          ;
          local_748.originalVar = &local_748.engineIdx;
          pcVar3 = (this->m_Options).cachepath._M_dataplus._M_p;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_748,pcVar3,
                     pcVar3 + (this->m_Options).cachepath._M_string_length);
          std::__cxx11::string::_M_replace_aux((ulong)&local_748,local_748.ioIdx,0,'\x01');
          plVar17 = (long *)std::__cxx11::string::_M_append
                                      ((char *)&local_748,
                                       (ulong)(this->m_CampaignData).hosts.
                                              super__Vector_base<adios2::core::engine::CampaignHost,_std::allocator<adios2::core::engine::CampaignHost>_>
                                              ._M_impl.super__Vector_impl_data._M_start
                                              [(long)p_Var25[3]._M_parent].hostname._M_dataplus._M_p
                                      );
          lVar37 = local_6d8;
          puVar26 = (ulong *)(plVar17 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar17 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)puVar26) {
            local_7e0.field_2._M_allocated_capacity = *puVar26;
            local_7e0.field_2._8_8_ = plVar17[3];
            local_7e0._M_dataplus._M_p = (pointer)&local_7e0.field_2;
          }
          else {
            local_7e0.field_2._M_allocated_capacity = *puVar26;
            local_7e0._M_dataplus._M_p = (pointer)*plVar17;
          }
          local_7e0._M_string_length = plVar17[1];
          *plVar17 = (long)puVar26;
          plVar17[1] = 0;
          *(undefined1 *)(plVar17 + 2) = 0;
          plVar17 = (long *)std::__cxx11::string::_M_replace_aux
                                      ((ulong)&local_7e0,local_7e0._M_string_length,0,'\x01');
          local_798 = &local_788;
          plVar28 = plVar17 + 2;
          if ((long *)*plVar17 == plVar28) {
            local_788 = *plVar28;
            lStack_780 = plVar17[3];
          }
          else {
            local_788 = *plVar28;
            local_798 = (long *)*plVar17;
          }
          local_790 = plVar17[1];
          *plVar17 = (long)plVar28;
          plVar17[1] = 0;
          *(undefined1 *)(plVar17 + 2) = 0;
          plVar17 = (long *)std::__cxx11::string::_M_append
                                      ((char *)&local_798,
                                       (ulong)(this->super_Engine).m_Name._M_dataplus._M_p);
          local_7c0._M_dataplus._M_p = (pointer)&local_7c0.field_2;
          psVar27 = (size_type *)(plVar17 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar17 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar27) {
            local_7c0.field_2._M_allocated_capacity = *psVar27;
            local_7c0.field_2._8_8_ = plVar17[3];
          }
          else {
            local_7c0.field_2._M_allocated_capacity = *psVar27;
            local_7c0._M_dataplus._M_p = (pointer)*plVar17;
          }
          local_7c0._M_string_length = plVar17[1];
          *plVar17 = (long)psVar27;
          plVar17[1] = 0;
          *(undefined1 *)(plVar17 + 2) = 0;
          std::
          _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
          ::_M_emplace_unique<char_const(&)[6],std::__cxx11::string>
                    ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                      *)local_678,(char (*) [6])0x74caf9,&local_7c0);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_7c0._M_dataplus._M_p != &local_7c0.field_2) {
            operator_delete(local_7c0._M_dataplus._M_p);
          }
          if (local_798 != &local_788) {
            operator_delete(local_798);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_7e0._M_dataplus._M_p != &local_7e0.field_2) {
            operator_delete(local_7e0._M_dataplus._M_p);
          }
          if ((size_t *)local_748.originalVar != &local_748.engineIdx) {
            operator_delete(local_748.originalVar);
          }
          uVar31 = *(uint *)(lVar37 + 0xd4);
          uVar29 = -uVar31;
          if (0 < (int)uVar31) {
            uVar29 = uVar31;
          }
          uVar30 = 1;
          if (9 < uVar29) {
            uVar36 = (ulong)uVar29;
            uVar11 = 4;
            do {
              uVar30 = uVar11;
              uVar15 = (uint)uVar36;
              if (uVar15 < 100) {
                uVar30 = uVar30 - 2;
                goto LAB_00660e1b;
              }
              if (uVar15 < 1000) {
                uVar30 = uVar30 - 1;
                goto LAB_00660e1b;
              }
              if (uVar15 < 10000) goto LAB_00660e1b;
              uVar36 = uVar36 / 10000;
              uVar11 = uVar30 + 4;
            } while (99999 < uVar15);
            uVar30 = uVar30 + 1;
          }
LAB_00660e1b:
          local_7c0._M_dataplus._M_p = (pointer)&local_7c0.field_2;
          std::__cxx11::string::_M_construct
                    ((ulong)&local_7c0,(char)uVar30 - (char)((int)uVar31 >> 0x1f));
          std::__detail::__to_chars_10_impl<unsigned_int>
                    (local_7c0._M_dataplus._M_p + (uVar31 >> 0x1f),uVar30,uVar29);
          std::
          _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
          ::_M_emplace_unique<char_const(&)[8],std::__cxx11::string>
                    ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                      *)local_678,(char (*) [8])0x7587e6,&local_7c0);
          lVar37 = local_6d8;
          this_02 = local_7a0;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_7c0._M_dataplus._M_p != &local_7c0.field_2) {
            operator_delete(local_7c0._M_dataplus._M_p);
          }
          pcVar18 = "AWS_EC2_METADATA_DISABLED=false";
          if (*(char *)(lVar37 + 0xd1) != '\0') {
            pcVar18 = "AWS_EC2_METADATA_DISABLED=true";
          }
          local_7c0._M_dataplus._M_p = pcVar18 + 0x1a;
          std::
          _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
          ::_M_emplace_unique<char_const(&)[17],char_const*>
                    ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                      *)local_678,(char (*) [17])"recheck_metadata",(char **)&local_7c0);
          local_2f0._M_dataplus._M_p = (pointer)&local_2f0.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_2f0,"File","");
          IO::AddTransport(this_01,&local_2f0,(Params *)local_678);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_2f0._M_dataplus._M_p != &local_2f0.field_2) {
            operator_delete(local_2f0._M_dataplus._M_p);
          }
          local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"BP5","");
          IO::SetEngine(this_01,&local_50);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_50._M_dataplus._M_p != &local_50.field_2) {
            operator_delete(local_50._M_dataplus._M_p);
          }
          pbVar6 = (this->m_CampaignData).directory.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          local_798 = &local_788;
          pcVar3 = pbVar6[(long)p_Var25[3]._M_left]._M_dataplus._M_p;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_798,pcVar3,
                     pcVar3 + pbVar6[(long)p_Var25[3]._M_left]._M_string_length);
          lVar37 = local_6d8;
          std::__cxx11::string::_M_replace_aux((ulong)&local_798,local_790,0,'\x01');
          puVar19 = (undefined8 *)
                    std::__cxx11::string::_M_append((char *)&local_798,(ulong)p_Var25[2]._M_parent);
          puVar26 = puVar19 + 2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*puVar19 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)puVar26) {
            local_7c0.field_2._M_allocated_capacity = *puVar26;
            local_7c0.field_2._8_8_ = puVar19[3];
            local_7c0._M_dataplus._M_p = (pointer)&local_7c0.field_2;
          }
          else {
            local_7c0.field_2._M_allocated_capacity = *puVar26;
            local_7c0._M_dataplus._M_p = (pointer)*puVar19;
          }
          local_7c0._M_string_length = puVar19[1];
          *puVar19 = puVar26;
          puVar19[1] = 0;
          *(undefined1 *)(puVar19 + 2) = 0;
          std::__cxx11::string::operator=((string *)&local_728,(string *)&local_7c0);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_7c0._M_dataplus._M_p != &local_7c0.field_2) {
            operator_delete(local_7c0._M_dataplus._M_p);
          }
          if (local_798 != &local_788) {
            operator_delete(local_798);
          }
          if (*(char *)(lVar37 + 0xd0) == '\x01') {
            local_7c0._M_dataplus._M_p = (pointer)&local_7c0.field_2;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_7c0,"AWS_EC2_METADATA_DISABLED=false","");
            adios2sys::SystemTools::PutEnv(&local_7c0);
          }
          else {
            local_7c0._M_dataplus._M_p = (pointer)&local_7c0.field_2;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_7c0,"AWS_EC2_METADATA_DISABLED=true","");
            adios2sys::SystemTools::PutEnv(&local_7c0);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_7c0._M_dataplus._M_p != &local_7c0.field_2) {
            operator_delete(local_7c0._M_dataplus._M_p);
          }
          if (*(long *)(lVar37 + 0xb8) == 0) {
            local_7c0._M_dataplus._M_p = (pointer)&local_7c0.field_2;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_7c0,"AWS_PROFILE=default","");
            adios2sys::SystemTools::PutEnv(&local_7c0);
          }
          else {
            std::operator+(&local_7c0,"AWS_PROFILE=",
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           (lVar37 + 0xb0));
            adios2sys::SystemTools::PutEnv(&local_7c0);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_7c0._M_dataplus._M_p != &local_7c0.field_2) {
            operator_delete(local_7c0._M_dataplus._M_p);
          }
          std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                       *)local_678);
          if ((undefined1 *)local_708._0_8_ != local_708 + 0x10) {
            operator_delete((void *)local_708._0_8_);
          }
          if ((undefined1 *)local_778._0_8_ != local_778 + 0x10) {
            operator_delete((void *)local_778._0_8_);
          }
          bVar12 = true;
        }
        if (bVar12) goto LAB_00661177;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_728._M_dataplus._M_p != &local_728.field_2) {
        operator_delete(local_728._M_dataplus._M_p);
      }
      p_Var25 = (_Base_ptr)std::_Rb_tree_increment(p_Var25);
      uVar31 = local_6bc;
    } while (p_Var25 != local_378);
  }
  if (this_02 != (Remote *)0x0) {
    (*this_02->_vptr_Remote[1])(this_02);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_698._M_dataplus._M_p != &local_698.field_2) {
    operator_delete(local_698._M_dataplus._M_p);
  }
  return;
}

Assistant:

void CampaignReader::InitTransports()
{
    std::string path = m_Name;
    if (!adios2sys::SystemTools::FileExists(path) && path[0] != '/' && path[0] != '\\' &&
        !m_Options.campaignstorepath.empty())
    {
        std::string path2 = m_Options.campaignstorepath + PathSeparator + m_Name;
        if (adios2sys::SystemTools::FileExists(path2))
        {
            path = path2;
        }
    }

    int rc = sqlite3_open(path.c_str(), &m_DB);
    if (rc)
    {
        std::string dbmsg(sqlite3_errmsg(m_DB));
        sqlite3_close(m_DB);
        helper::Throw<std::invalid_argument>("Engine", "CampaignReader", "Open",
                                             "Cannot open database" + path + ": " + dbmsg);
    }

    ReadCampaignData(m_DB, m_CampaignData);

    if (m_Options.verbose > 0)
    {
        std::cout << "Local hostname = " << m_Options.hostname << "\n";
        std::cout << "Database result:\n  version = " << m_CampaignData.version.version
                  << "\n  hosts:\n";

        for (size_t hostidx = 0; hostidx < m_CampaignData.hosts.size(); ++hostidx)
        {
            CampaignHost &h = m_CampaignData.hosts[hostidx];
            std::cout << "    host = " << h.hostname << "  long name = " << h.longhostname
                      << "  directories: \n";
            for (size_t diridx = 0; diridx < h.dirIdx.size(); ++diridx)
            {
                std::cout << "      dir = " << m_CampaignData.directory[h.dirIdx[diridx]] << "\n";
            }
        }
        std::cout << "  keys:\n";
        for (size_t keyidx = 0; keyidx < m_CampaignData.keys.size(); ++keyidx)
        {
            CampaignKey &k = m_CampaignData.keys[keyidx];
            std::cout << "    key = " << k.id << "\n";
        }
        std::cout << "  datasets:\n";
        for (auto &it : m_CampaignData.bpdatasets)
        {
            CampaignBPDataset &ds = it.second;
            std::cout << "    " << m_CampaignData.hosts[ds.hostIdx].hostname << ":"
                      << m_CampaignData.directory[ds.dirIdx] << PathSeparator << ds.name << "\n";
            std::cout << "      uuid: " << ds.uuid << "\n";
            for (auto &bpf : ds.files)
            {
                std::cout << "      file: " << bpf.name << "\n";
            }
        }
    }

    // std::string cs = m_Comm.BroadcastFile(m_Name, "broadcast campaign file");
    // nlohmann::json js = nlohmann::json::parse(cs);
    // std::cout << "JSON rank " << m_ReaderRank << ": " << js.size() <<
    // std::endl;
    std::unique_ptr<Remote> connectionManager = nullptr;
    int i = -1;
    for (auto &it : m_CampaignData.bpdatasets)
    {
        ++i;
        CampaignBPDataset &ds = it.second;
        adios2::core::IO &io = m_IO.m_ADIOS.DeclareIO("CampaignReader" + std::to_string(i));
        std::string localPath;
        if (m_CampaignData.hosts[ds.hostIdx].hostname != m_Options.hostname)
        {
            bool done = false;
            auto it = m_HostOptions.find(m_CampaignData.hosts[ds.hostIdx].hostname);
            if (it != m_HostOptions.end())
            {
                const HostConfig &ho = (it->second).front();
                if (ho.protocol == HostAccessProtocol::S3)
                {
                    const std::string endpointURL = ho.endpoint;
                    const std::string objPath = m_CampaignData.directory[ds.dirIdx] + "/" + ds.name;
                    Params p;
                    p.emplace("Library", "awssdk");
                    p.emplace("endpoint", endpointURL);
                    p.emplace("cache", m_Options.cachepath + PathSeparator +
                                           m_CampaignData.hosts[ds.hostIdx].hostname +
                                           PathSeparator + m_Name);
                    p.emplace("verbose", std::to_string(ho.verbose));
                    p.emplace("recheck_metadata", (ho.recheckMetadata ? "true" : "false"));
                    io.AddTransport("File", p);
                    io.SetEngine("BP5");
                    localPath = m_CampaignData.directory[ds.dirIdx] + PathSeparator + ds.name;
                    if (ho.isAWS_EC2)
                    {
                        adios2sys::SystemTools::PutEnv("AWS_EC2_METADATA_DISABLED=false");
                    }
                    else
                    {
                        adios2sys::SystemTools::PutEnv("AWS_EC2_METADATA_DISABLED=true");
                    }

                    if (ho.awsProfile.empty())
                    {
                        adios2sys::SystemTools::PutEnv("AWS_PROFILE=default");
                    }
                    else
                    {
                        std::string es = "AWS_PROFILE=" + ho.awsProfile;
                        adios2sys::SystemTools::PutEnv(es);
                    }

                    done = true;
                }
            }

            if (!done)
            {
                const std::string remotePath =
                    m_CampaignData.directory[ds.dirIdx] + PathSeparator + ds.name;
                const std::string remoteURL =
                    m_CampaignData.hosts[ds.hostIdx].hostname + ":" + remotePath;
                localPath = m_Options.cachepath + PathSeparator + ds.uuid.substr(0, 3) +
                            PathSeparator + ds.uuid;
                if (m_Options.verbose > 0)
                {
                    std::cout << "Open remote file " << remoteURL
                              << "\n    and use local cache for metadata at " << localPath << " \n";
                }
                helper::CreateDirectory(localPath);

                std::string keyhex;
                if (ds.hasKey)
                {
                    if (m_Options.verbose > 0)
                    {
                        std::cout << "The dataset is key protected with key id "
                                  << m_CampaignData.keys[ds.keyIdx].id << "\n";
                    }
#ifdef ADIOS2_HAVE_SODIUM
                    if (m_CampaignData.keys[ds.keyIdx].keyHex.empty())
                    {
                        // Retrieve key
                        if (!connectionManager)
                        {
                            connectionManager = std::unique_ptr<Remote>(
                                new Remote(core::ADIOS::StaticGetHostOptions()));
                        }
                        m_CampaignData.keys[ds.keyIdx].keyHex =
                            connectionManager->GetKeyFromConnectionManager(
                                m_CampaignData.keys[ds.keyIdx].id);

                        if (m_Options.verbose > 0)
                        {
                            std::cout << "-- Received key " << m_CampaignData.keys[ds.keyIdx].keyHex
                                      << "\n";
                        }
                    }

                    if (m_CampaignData.keys[ds.keyIdx].keyHex == "0")
                    {
                        // We received no key, ignore files encrypted with this key
                        std::cerr << "ERROR: don't have the key "
                                  << m_CampaignData.keys[ds.keyIdx].id << " to decrypt " << ds.name
                                  << ". Ignoring this dataset." << std::endl;
                        continue;
                    }

                    keyhex = m_CampaignData.keys[ds.keyIdx].keyHex;
#else
                    helper::Throw<std::runtime_error>(
                        "Engine", "CampaignReader", "InitTransports",
                        "ADIOS needs to be built with libsodium and with SST to "
                        "be able to process protected campaign files");
#endif
                }

                for (auto &bpf : ds.files)
                {
                    SaveToFile(m_DB, localPath + PathSeparator + bpf.name, bpf, keyhex);
                }
                io.SetParameter("RemoteDataPath", remotePath);
                io.SetParameter("RemoteHost", m_CampaignData.hosts[ds.hostIdx].hostname);
                io.SetParameter("UUID", ds.uuid);

                // Save info in cache directory for cache manager and for humans
                {
                    std::ofstream f(localPath + PathSeparator + "info.txt");
                    if (f.is_open())
                    {
                        f << "Campaign = " << m_Name << "\n";
                        f << "Dataset = " << ds.name << "\n";
                        f << "RemoteHost = " << m_CampaignData.hosts[ds.hostIdx].hostname << "\n";
                        f << "RemoteDataPath = " << remotePath << "\n";
                        f.close();
                    }
                }
            }
        }
        else
        {
            localPath = m_CampaignData.directory[ds.dirIdx] + PathSeparator + ds.name;
            if (m_Options.verbose > 0)
            {
                std::cout << "Open local file " << localPath << "\n";
            }
        }

        adios2::core::Engine &e = io.Open(localPath, m_OpenMode, m_Comm.Duplicate());

        m_IOs.push_back(&io);
        m_Engines.push_back(&e);

        auto vmap = io.GetAvailableVariables();
        auto amap = io.GetAvailableAttributes();
        VarInternalInfo internalInfo(nullptr, m_IOs.size() - 1, m_Engines.size() - 1);

        for (auto &vr : vmap)
        {
            auto vname = vr.first;
            std::string fname = ds.name;
            std::string newname = fname + "/" + vname;

            const DataType type = io.InquireVariableType(vname);

            if (type == DataType::Struct)
            {
            }
#define declare_type(T)                                                                            \
    else if (type == helper::GetDataType<T>())                                                     \
    {                                                                                              \
        Variable<T> *vi = io.InquireVariable<T>(vname);                                            \
        Variable<T> v = DuplicateVariable(vi, m_IO, newname, internalInfo);                        \
    }

            ADIOS2_FOREACH_STDTYPE_1ARG(declare_type)
#undef declare_type
        }

        for (auto &ar : amap)
        {
            auto aname = ar.first;
            std::string fname = ds.name;
            std::string newname = fname + "/" + aname;

            const DataType type = io.InquireAttributeType(aname);

            if (type == DataType::Struct)
            {
            }
#define declare_type(T)                                                                            \
    else if (type == helper::GetDataType<T>())                                                     \
    {                                                                                              \
        Attribute<T> *ai = io.InquireAttribute<T>(aname);                                          \
        Attribute<T> v = DuplicateAttribute(ai, m_IO, newname);                                    \
    }

            ADIOS2_FOREACH_STDTYPE_1ARG(declare_type)
#undef declare_type
        }
    }
}